

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O1

void stbir__decode_scanline(stbir__info *stbir_info,int n)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  stbir_edge sVar4;
  stbir_datatype sVar5;
  float *pfVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  float *pfVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  float fVar23;
  int max2_3;
  
  uVar1 = stbir_info->channels;
  lVar19 = (long)(int)uVar1;
  uVar2 = stbir_info->alpha_channel;
  lVar10 = (long)(int)uVar2;
  iVar21 = stbir_info->input_w;
  iVar20 = stbir_info->input_h;
  pfVar6 = stbir_info->decode_buffer;
  iVar3 = stbir_info->horizontal_filter_pixel_margin;
  sVar4 = stbir_info->edge_horizontal;
  iVar8 = n;
  if (n < 0 || iVar20 <= n) {
    iVar8 = 0;
    switch(stbir_info->edge_vertical) {
    case STBIR_EDGE_CLAMP:
      if ((-1 < n) && (iVar8 = iVar20 + -1, n < iVar20)) {
        iVar8 = n;
      }
      break;
    case STBIR_EDGE_REFLECT:
      if (n < 0) {
        if (n < iVar20) {
          iVar8 = -n;
        }
        else {
          iVar8 = iVar20 + -1;
        }
      }
      else {
        iVar8 = n;
        if (iVar20 <= n) {
          iVar8 = ~n + iVar20 * 2;
          if (iVar20 * 2 <= n) {
            iVar8 = 0;
          }
        }
      }
      break;
    case STBIR_EDGE_WRAP:
      iVar9 = n % iVar20;
      iVar8 = iVar9;
      if ((n < 0) && (iVar8 = iVar9 + iVar20, iVar9 == 0)) {
        iVar8 = iVar9;
      }
      break;
    case STBIR_EDGE_ZERO:
      break;
    default:
switchD_00137724_default:
      __assert_fail("!\"Unimplemented edge type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                    ,0x3e3,"int stbir__edge_wrap_slow(stbir_edge, int, int)");
    }
  }
  uVar15 = (ulong)uVar1;
  lVar18 = (long)(int)(iVar3 * uVar1);
  lVar13 = (long)iVar8 * (long)stbir_info->input_stride_bytes;
  pvVar7 = stbir_info->input_data;
  iVar8 = iVar21 + iVar3;
  iVar9 = -iVar3;
  if ((stbir_info->edge_vertical == STBIR_EDGE_ZERO) && (n < 0 || iVar20 <= n)) {
    if (iVar8 != iVar9 && SBORROW4(iVar8,iVar9) == iVar8 + iVar3 < 0) {
      iVar21 = iVar21 + iVar3 * 2;
      iVar20 = -(iVar3 * uVar1);
      do {
        if (0 < (int)uVar1) {
          memset(pfVar6 + lVar18 + iVar20,0,uVar15 << 2);
        }
        iVar20 = iVar20 + uVar1;
        iVar21 = iVar21 + -1;
      } while (iVar21 != 0);
    }
  }
  else {
    uVar11 = stbir_info->colorspace + stbir_info->type * 2;
    if (7 < uVar11) {
      __assert_fail("!\"Unknown type/colorspace/channels combination.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                    ,0x559,"void stbir__decode_scanline(stbir__info *, int)");
    }
    lVar14 = (long)iVar21;
    switch(uVar11) {
    case 0:
      if (iVar8 != iVar9 && SBORROW4(iVar8,iVar9) == iVar8 + iVar3 < 0) {
        uVar17 = (ulong)iVar9;
        pfVar16 = pfVar6 + lVar19 * uVar17 + lVar18;
        do {
          uVar11 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar14 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar21 - 1U;
              if ((long)uVar17 < lVar14) {
                uVar12 = uVar11;
              }
              uVar11 = uVar12;
              if ((long)uVar17 < 0) {
                uVar11 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar11 = -uVar11;
                if (lVar14 <= (long)uVar17) {
                  uVar11 = iVar21 - 1U;
                }
              }
              else if ((lVar14 <= (long)uVar17) &&
                      (uVar11 = ~uVar11 + (int)(lVar14 * 2), lVar14 * 2 <= (long)uVar17)) {
                uVar11 = 0;
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar21);
              uVar11 = uVar12;
              if (((long)uVar17 < 0) && (uVar11 = iVar21 + uVar12, uVar12 == 0)) {
                uVar11 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar11 = 0;
              break;
            default:
              goto switchD_00137724_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar22 = 0;
            do {
              pfVar16[uVar22] =
                   (float)*(byte *)((long)pvVar7 + uVar22 + (int)(uVar11 * uVar1) + lVar13) / 255.0;
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          uVar17 = uVar17 + 1;
          pfVar16 = pfVar16 + lVar19;
        } while (iVar8 != (int)uVar17);
      }
      break;
    case 1:
      if (iVar8 != iVar9 && SBORROW4(iVar8,iVar9) == iVar8 + iVar3 < 0) {
        uVar17 = (ulong)iVar9;
        pfVar16 = pfVar6 + lVar19 * uVar17 + lVar18;
        do {
          uVar11 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar14 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar21 - 1U;
              if ((long)uVar17 < lVar14) {
                uVar12 = uVar11;
              }
              uVar11 = uVar12;
              if ((long)uVar17 < 0) {
                uVar11 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar11 = -uVar11;
                if (lVar14 <= (long)uVar17) {
                  uVar11 = iVar21 - 1U;
                }
              }
              else if (lVar14 <= (long)uVar17) {
                uVar11 = ~uVar11 + (int)(lVar14 * 2);
                if (lVar14 * 2 <= (long)uVar17) {
                  uVar11 = 0;
                }
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar21);
              uVar11 = uVar12;
              if (((long)uVar17 < 0) && (uVar11 = iVar21 + uVar12, uVar12 == 0)) {
                uVar11 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar11 = 0;
              break;
            default:
              goto switchD_00137724_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar22 = 0;
            do {
              pfVar16[uVar22] =
                   stbir__srgb_uchar_to_linear_float
                   [*(byte *)((long)pvVar7 + uVar22 + (int)(uVar1 * uVar11) + lVar13)];
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          if ((stbir_info->flags & 2) == 0) {
            pfVar6[lVar18 + lVar10 + uVar17 * lVar19] =
                 (float)*(byte *)((long)pvVar7 + (int)(uVar1 * uVar11) + lVar10 + lVar13) / 255.0;
          }
          uVar17 = uVar17 + 1;
          pfVar16 = pfVar16 + lVar19;
        } while (iVar8 != (int)uVar17);
      }
      break;
    case 2:
      if (iVar8 != iVar9 && SBORROW4(iVar8,iVar9) == iVar8 + iVar3 < 0) {
        uVar17 = (ulong)iVar9;
        pfVar16 = pfVar6 + lVar19 * uVar17 + lVar18;
        do {
          uVar11 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar14 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar21 - 1U;
              if ((long)uVar17 < lVar14) {
                uVar12 = uVar11;
              }
              uVar11 = uVar12;
              if ((long)uVar17 < 0) {
                uVar11 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar11 = -uVar11;
                if (lVar14 <= (long)uVar17) {
                  uVar11 = iVar21 - 1U;
                }
              }
              else if ((lVar14 <= (long)uVar17) &&
                      (uVar11 = ~uVar11 + (int)(lVar14 * 2), lVar14 * 2 <= (long)uVar17)) {
                uVar11 = 0;
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar21);
              uVar11 = uVar12;
              if (((long)uVar17 < 0) && (uVar11 = iVar21 + uVar12, uVar12 == 0)) {
                uVar11 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar11 = 0;
              break;
            default:
              goto switchD_00137724_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar22 = 0;
            do {
              pfVar16[uVar22] =
                   (float)*(ushort *)
                           ((long)pvVar7 + uVar22 * 2 + (long)(int)(uVar11 * uVar1) * 2 + lVar13) /
                   65535.0;
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          uVar17 = uVar17 + 1;
          pfVar16 = pfVar16 + lVar19;
        } while (iVar8 != (int)uVar17);
      }
      break;
    case 3:
      if (iVar8 != iVar9 && SBORROW4(iVar8,iVar9) == iVar8 + iVar3 < 0) {
        uVar17 = (ulong)iVar9;
        pfVar16 = pfVar6 + lVar19 * uVar17 + lVar18;
        do {
          uVar11 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar14 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar21 - 1U;
              if ((long)uVar17 < lVar14) {
                uVar12 = uVar11;
              }
              uVar11 = uVar12;
              if ((long)uVar17 < 0) {
                uVar11 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar11 = -uVar11;
                if (lVar14 <= (long)uVar17) {
                  uVar11 = iVar21 - 1U;
                }
              }
              else if (lVar14 <= (long)uVar17) {
                uVar11 = ~uVar11 + (int)(lVar14 * 2);
                if (lVar14 * 2 <= (long)uVar17) {
                  uVar11 = 0;
                }
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar21);
              uVar11 = uVar12;
              if (((long)uVar17 < 0) && (uVar11 = iVar21 + uVar12, uVar12 == 0)) {
                uVar11 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar11 = 0;
              break;
            default:
              goto switchD_00137724_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar22 = 0;
            do {
              fVar23 = (float)*(ushort *)
                               ((long)pvVar7 + uVar22 * 2 + (long)(int)(uVar1 * uVar11) * 2 + lVar13
                               ) / 65535.0;
              if (fVar23 <= 0.04045) {
                fVar23 = fVar23 / 12.92;
              }
              else {
                fVar23 = powf((fVar23 + 0.055) / 1.055,2.4);
              }
              pfVar16[uVar22] = fVar23;
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          if ((stbir_info->flags & 2) == 0) {
            pfVar6[lVar18 + lVar10 + uVar17 * lVar19] =
                 (float)*(ushort *)((long)pvVar7 + (long)(int)(uVar1 * uVar11 + uVar2) * 2 + lVar13)
                 / 65535.0;
          }
          uVar17 = uVar17 + 1;
          pfVar16 = pfVar16 + lVar19;
        } while (iVar8 != (int)uVar17);
      }
      break;
    case 4:
      if (iVar8 != iVar9 && SBORROW4(iVar8,iVar9) == iVar8 + iVar3 < 0) {
        uVar17 = (ulong)iVar9;
        pfVar16 = pfVar6 + lVar19 * uVar17 + lVar18;
        do {
          uVar11 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar14 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar21 - 1U;
              if ((long)uVar17 < lVar14) {
                uVar12 = uVar11;
              }
              uVar11 = uVar12;
              if ((long)uVar17 < 0) {
                uVar11 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar11 = -uVar11;
                if (lVar14 <= (long)uVar17) {
                  uVar11 = iVar21 - 1U;
                }
              }
              else if ((lVar14 <= (long)uVar17) &&
                      (uVar11 = ~uVar11 + (int)(lVar14 * 2), lVar14 * 2 <= (long)uVar17)) {
                uVar11 = 0;
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar21);
              uVar11 = uVar12;
              if (((long)uVar17 < 0) && (uVar11 = iVar21 + uVar12, uVar12 == 0)) {
                uVar11 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar11 = 0;
              break;
            default:
              goto switchD_00137724_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar22 = 0;
            do {
              pfVar16[uVar22] =
                   (float)((double)*(uint *)((long)pvVar7 +
                                            uVar22 * 4 + (long)(int)(uVar11 * uVar1) * 4 + lVar13) /
                          4294967295.0);
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          uVar17 = uVar17 + 1;
          pfVar16 = pfVar16 + lVar19;
        } while (iVar8 != (int)uVar17);
      }
      break;
    case 5:
      if (iVar8 != iVar9 && SBORROW4(iVar8,iVar9) == iVar8 + iVar3 < 0) {
        uVar17 = (ulong)iVar9;
        pfVar16 = pfVar6 + lVar19 * uVar17 + lVar18;
        do {
          uVar11 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar14 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar21 - 1U;
              if ((long)uVar17 < lVar14) {
                uVar12 = uVar11;
              }
              uVar11 = uVar12;
              if ((long)uVar17 < 0) {
                uVar11 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar11 = -uVar11;
                if (lVar14 <= (long)uVar17) {
                  uVar11 = iVar21 - 1U;
                }
              }
              else if (lVar14 <= (long)uVar17) {
                uVar11 = ~uVar11 + (int)(lVar14 * 2);
                if (lVar14 * 2 <= (long)uVar17) {
                  uVar11 = 0;
                }
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar21);
              uVar11 = uVar12;
              if (((long)uVar17 < 0) && (uVar11 = iVar21 + uVar12, uVar12 == 0)) {
                uVar11 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar11 = 0;
              break;
            default:
              goto switchD_00137724_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar22 = 0;
            do {
              fVar23 = (float)((double)*(uint *)((long)pvVar7 +
                                                uVar22 * 4 +
                                                (long)(int)(uVar1 * uVar11) * 4 + lVar13) /
                              4294967295.0);
              if (fVar23 <= 0.04045) {
                fVar23 = fVar23 / 12.92;
              }
              else {
                fVar23 = powf((fVar23 + 0.055) / 1.055,2.4);
              }
              pfVar16[uVar22] = fVar23;
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          if ((stbir_info->flags & 2) == 0) {
            pfVar6[lVar18 + lVar10 + uVar17 * lVar19] =
                 (float)((double)*(uint *)((long)pvVar7 +
                                          (long)(int)(uVar1 * uVar11 + uVar2) * 4 + lVar13) /
                        4294967295.0);
          }
          uVar17 = uVar17 + 1;
          pfVar16 = pfVar16 + lVar19;
        } while (iVar8 != (int)uVar17);
      }
      break;
    case 6:
      if (iVar8 != iVar9 && SBORROW4(iVar8,iVar9) == iVar8 + iVar3 < 0) {
        uVar17 = (ulong)iVar9;
        pfVar16 = pfVar6 + lVar19 * uVar17 + lVar18;
        do {
          uVar11 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar14 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar21 - 1U;
              if ((long)uVar17 < lVar14) {
                uVar12 = uVar11;
              }
              uVar11 = uVar12;
              if ((long)uVar17 < 0) {
                uVar11 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar11 = -uVar11;
                if (lVar14 <= (long)uVar17) {
                  uVar11 = iVar21 - 1U;
                }
              }
              else if ((lVar14 <= (long)uVar17) &&
                      (uVar11 = ~uVar11 + (int)(lVar14 * 2), lVar14 * 2 <= (long)uVar17)) {
                uVar11 = 0;
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar21);
              uVar11 = uVar12;
              if (((long)uVar17 < 0) && (uVar11 = iVar21 + uVar12, uVar12 == 0)) {
                uVar11 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar11 = 0;
              break;
            default:
              goto switchD_00137724_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar22 = 0;
            do {
              pfVar16[uVar22] =
                   *(float *)((long)pvVar7 + uVar22 * 4 + (long)(int)(uVar11 * uVar1) * 4 + lVar13);
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          uVar17 = uVar17 + 1;
          pfVar16 = pfVar16 + lVar19;
        } while (iVar8 != (int)uVar17);
      }
      break;
    case 7:
      if (iVar8 != iVar9 && SBORROW4(iVar8,iVar9) == iVar8 + iVar3 < 0) {
        uVar17 = (ulong)iVar9;
        pfVar16 = pfVar6 + lVar19 * uVar17 + lVar18;
        do {
          uVar11 = (uint)uVar17;
          if ((long)uVar17 < 0 || lVar14 <= (long)uVar17) {
            switch(sVar4) {
            case STBIR_EDGE_CLAMP:
              uVar12 = iVar21 - 1U;
              if ((long)uVar17 < lVar14) {
                uVar12 = uVar11;
              }
              uVar11 = uVar12;
              if ((long)uVar17 < 0) {
                uVar11 = 0;
              }
              break;
            case STBIR_EDGE_REFLECT:
              if ((long)uVar17 < 0) {
                uVar11 = -uVar11;
                if (lVar14 <= (long)uVar17) {
                  uVar11 = iVar21 - 1U;
                }
              }
              else if (lVar14 <= (long)uVar17) {
                uVar11 = ~uVar11 + (int)(lVar14 * 2);
                if (lVar14 * 2 <= (long)uVar17) {
                  uVar11 = 0;
                }
              }
              break;
            case STBIR_EDGE_WRAP:
              uVar12 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                    uVar17 & 0xffffffff) % (long)iVar21);
              uVar11 = uVar12;
              if (((long)uVar17 < 0) && (uVar11 = iVar21 + uVar12, uVar12 == 0)) {
                uVar11 = uVar12;
              }
              break;
            case STBIR_EDGE_ZERO:
              uVar11 = 0;
              break;
            default:
              goto switchD_00137724_default;
            }
          }
          if (0 < (int)uVar1) {
            uVar22 = 0;
            do {
              fVar23 = *(float *)((long)pvVar7 +
                                 uVar22 * 4 + (long)(int)(uVar1 * uVar11) * 4 + lVar13);
              if (fVar23 <= 0.04045) {
                fVar23 = fVar23 / 12.92;
              }
              else {
                fVar23 = powf((fVar23 + 0.055) / 1.055,2.4);
              }
              pfVar16[uVar22] = fVar23;
              uVar22 = uVar22 + 1;
            } while (uVar15 != uVar22);
          }
          if ((stbir_info->flags & 2) == 0) {
            pfVar6[lVar18 + lVar10 + uVar17 * lVar19] =
                 *(float *)((long)pvVar7 + (long)(int)(uVar1 * uVar11 + uVar2) * 4 + lVar13);
          }
          uVar17 = uVar17 + 1;
          pfVar16 = pfVar16 + lVar19;
        } while (iVar8 != (int)uVar17);
      }
    }
    if ((stbir_info->flags & 1) == 0) {
      lVar13 = -(long)stbir_info->horizontal_filter_pixel_margin;
      if ((int)lVar13 < iVar8) {
        sVar5 = stbir_info->type;
        pfVar16 = pfVar6 + (lVar18 - stbir_info->horizontal_filter_pixel_margin * lVar19);
        do {
          fVar23 = pfVar6[lVar18 + lVar10 + lVar13 * lVar19];
          if (sVar5 != STBIR_TYPE_FLOAT) {
            fVar23 = fVar23 + 8.271806e-25;
            pfVar6[lVar18 + lVar10 + lVar13 * lVar19] = fVar23;
          }
          if (0 < (int)uVar1) {
            uVar17 = 0;
            do {
              if (uVar2 != uVar17) {
                pfVar16[uVar17] = pfVar16[uVar17] * fVar23;
              }
              uVar17 = uVar17 + 1;
            } while (uVar15 != uVar17);
          }
          lVar13 = lVar13 + 1;
          pfVar16 = pfVar16 + lVar19;
        } while (iVar8 != (int)lVar13);
      }
    }
    if (sVar4 == STBIR_EDGE_ZERO) {
      lVar10 = (long)stbir_info->horizontal_filter_pixel_margin;
      if (0 < lVar10) {
        iVar20 = -(stbir_info->horizontal_filter_pixel_margin * uVar1);
        do {
          if (0 < (int)uVar1) {
            memset(pfVar6 + lVar18 + iVar20,0,uVar15 * 4);
          }
          iVar20 = iVar20 + uVar1;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      if (0 < iVar3) {
        iVar20 = iVar21 * uVar1;
        do {
          if (0 < (int)uVar1) {
            memset(pfVar6 + lVar18 + iVar20,0,uVar15 * 4);
          }
          iVar21 = iVar21 + 1;
          iVar20 = iVar20 + uVar1;
        } while (iVar21 < iVar8);
      }
    }
  }
  return;
}

Assistant:

static void stbir__decode_scanline(stbir__info* stbir_info, int n)
{
    int c;
    int channels = stbir_info->channels;
    int alpha_channel = stbir_info->alpha_channel;
    int type = stbir_info->type;
    int colorspace = stbir_info->colorspace;
    int input_w = stbir_info->input_w;
    size_t input_stride_bytes = stbir_info->input_stride_bytes;
    float* decode_buffer = stbir__get_decode_buffer(stbir_info);
    stbir_edge edge_horizontal = stbir_info->edge_horizontal;
    stbir_edge edge_vertical = stbir_info->edge_vertical;
    size_t in_buffer_row_offset = stbir__edge_wrap(edge_vertical, n, stbir_info->input_h) * input_stride_bytes;
    const void* input_data = (char *) stbir_info->input_data + in_buffer_row_offset;
    int max_x = input_w + stbir_info->horizontal_filter_pixel_margin;
    int decode = STBIR__DECODE(type, colorspace);

    int x = -stbir_info->horizontal_filter_pixel_margin;

    // special handling for STBIR_EDGE_ZERO because it needs to return an item that doesn't appear in the input,
    // and we want to avoid paying overhead on every pixel if not STBIR_EDGE_ZERO
    if (edge_vertical == STBIR_EDGE_ZERO && (n < 0 || n >= stbir_info->input_h))
    {
        for (; x < max_x; x++)
            for (c = 0; c < channels; c++)
                decode_buffer[x*channels + c] = 0;
        return;
    }

    switch (decode)
    {
    case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = ((float)((const unsigned char*)input_data)[input_pixel_index + c]) / stbir__max_uint8_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_uchar_to_linear_float[((const unsigned char*)input_data)[input_pixel_index + c]];

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = ((float)((const unsigned char*)input_data)[input_pixel_index + alpha_channel]) / stbir__max_uint8_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = ((float)((const unsigned short*)input_data)[input_pixel_index + c]) / stbir__max_uint16_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_to_linear(((float)((const unsigned short*)input_data)[input_pixel_index + c]) / stbir__max_uint16_as_float);

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = ((float)((const unsigned short*)input_data)[input_pixel_index + alpha_channel]) / stbir__max_uint16_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = (float)(((double)((const unsigned int*)input_data)[input_pixel_index + c]) / stbir__max_uint32_as_float);
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_to_linear((float)(((double)((const unsigned int*)input_data)[input_pixel_index + c]) / stbir__max_uint32_as_float));

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = (float)(((double)((const unsigned int*)input_data)[input_pixel_index + alpha_channel]) / stbir__max_uint32_as_float);
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = ((const float*)input_data)[input_pixel_index + c];
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_to_linear(((const float*)input_data)[input_pixel_index + c]);

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = ((const float*)input_data)[input_pixel_index + alpha_channel];
        }

        break;

    default:
        STBIR_ASSERT(!"Unknown type/colorspace/channels combination.");
        break;
    }

    if (!(stbir_info->flags & STBIR_FLAG_ALPHA_PREMULTIPLIED))
    {
        for (x = -stbir_info->horizontal_filter_pixel_margin; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;

            // If the alpha value is 0 it will clobber the color values. Make sure it's not.
            float alpha = decode_buffer[decode_pixel_index + alpha_channel];
#ifndef STBIR_NO_ALPHA_EPSILON
            if (stbir_info->type != STBIR_TYPE_FLOAT) {
                alpha += STBIR_ALPHA_EPSILON;
                decode_buffer[decode_pixel_index + alpha_channel] = alpha;
            }
#endif
            for (c = 0; c < channels; c++)
            {
                if (c == alpha_channel)
                    continue;

                decode_buffer[decode_pixel_index + c] *= alpha;
            }
        }
    }

    if (edge_horizontal == STBIR_EDGE_ZERO)
    {
        for (x = -stbir_info->horizontal_filter_pixel_margin; x < 0; x++)
        {
            for (c = 0; c < channels; c++)
                decode_buffer[x*channels + c] = 0;
        }
        for (x = input_w; x < max_x; x++)
        {
            for (c = 0; c < channels; c++)
                decode_buffer[x*channels + c] = 0;
        }
    }
}